

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

float * stbi__hdr_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri)

{
  stbi_uc *psVar1;
  bool bVar2;
  stbi_uc sVar3;
  stbi_uc sVar4;
  stbi_uc sVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  float *output;
  stbi_uc *__ptr;
  byte *pbVar11;
  stbi_uc *psVar12;
  char *pcVar13;
  int req_comp_00;
  int req_comp_01;
  long extraout_RDX;
  long extraout_RDX_00;
  long extraout_RDX_01;
  long extraout_RDX_02;
  long extraout_RDX_03;
  long lVar14;
  long extraout_RDX_04;
  byte bVar15;
  long lVar16;
  stbi_uc *psVar17;
  uint uVar18;
  long *in_FS_OFFSET;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  stbi_uc rgbe [4];
  stbi_uc rgbe_1 [4];
  char buffer [1024];
  char *local_4a0;
  ulong local_498;
  long local_490;
  stbi_uc *local_488;
  stbi_uc *local_480;
  long local_478;
  ulong local_470;
  ulong local_468;
  ulong local_460;
  ulong local_458;
  ulong local_450;
  ulong local_448;
  stbi_uc local_440;
  stbi_uc local_43f;
  stbi_uc local_43e;
  stbi_uc local_43d;
  stbi_uc local_43c [4];
  char local_438;
  char cStack_437;
  char cStack_436;
  char cStack_435;
  char cStack_434;
  char cStack_433;
  char cStack_432;
  char cStack_431;
  char cStack_430;
  char cStack_42f;
  char cStack_42e;
  char cStack_42d;
  char cStack_42c;
  char cStack_42b;
  char cStack_42a;
  char cStack_429;
  char cStack_428;
  char cStack_427;
  char cStack_426;
  char cStack_425;
  char cStack_424;
  char cStack_423;
  char cStack_422;
  
  stbi__hdr_gettoken(s,&local_438);
  if ((CONCAT17(cStack_42e,
                CONCAT16(cStack_42f,
                         CONCAT15(cStack_430,
                                  CONCAT14(cStack_431,
                                           CONCAT13(cStack_432,
                                                    CONCAT12(cStack_433,
                                                             CONCAT11(cStack_434,cStack_435)))))))
       == 0x45434e41494441 &&
       CONCAT17(cStack_431,
                CONCAT16(cStack_432,
                         CONCAT15(cStack_433,
                                  CONCAT14(cStack_434,
                                           CONCAT13(cStack_435,
                                                    CONCAT12(cStack_436,
                                                             CONCAT11(cStack_437,local_438))))))) ==
       0x4e41494441523f23) ||
     (CONCAT13(cStack_432,CONCAT12(cStack_433,CONCAT11(cStack_434,cStack_435))) == 0x454247 &&
      CONCAT13(cStack_435,CONCAT12(cStack_436,CONCAT11(cStack_437,local_438))) == 0x47523f23)) {
    stbi__hdr_gettoken(s,&local_438);
    if (local_438 != '\0') {
      bVar2 = false;
      do {
        auVar19[0] = -(cStack_431 == '3');
        auVar19[1] = -(cStack_430 == '2');
        auVar19[2] = -(cStack_42f == '-');
        auVar19[3] = -(cStack_42e == 'b');
        auVar19[4] = -(cStack_42d == 'i');
        auVar19[5] = -(cStack_42c == 't');
        auVar19[6] = -(cStack_42b == '_');
        auVar19[7] = -(cStack_42a == 'r');
        auVar19[8] = -(cStack_429 == 'l');
        auVar19[9] = -(cStack_428 == 'e');
        auVar19[10] = -(cStack_427 == '_');
        auVar19[0xb] = -(cStack_426 == 'r');
        auVar19[0xc] = -(cStack_425 == 'g');
        auVar19[0xd] = -(cStack_424 == 'b');
        auVar19[0xe] = -(cStack_423 == 'e');
        auVar19[0xf] = -(cStack_422 == '\0');
        auVar20[0] = -(local_438 == 'F');
        auVar20[1] = -(cStack_437 == 'O');
        auVar20[2] = -(cStack_436 == 'R');
        auVar20[3] = -(cStack_435 == 'M');
        auVar20[4] = -(cStack_434 == 'A');
        auVar20[5] = -(cStack_433 == 'T');
        auVar20[6] = -(cStack_432 == '=');
        auVar20[7] = -(cStack_431 == '3');
        auVar20[8] = -(cStack_430 == '2');
        auVar20[9] = -(cStack_42f == '-');
        auVar20[10] = -(cStack_42e == 'b');
        auVar20[0xb] = -(cStack_42d == 'i');
        auVar20[0xc] = -(cStack_42c == 't');
        auVar20[0xd] = -(cStack_42b == '_');
        auVar20[0xe] = -(cStack_42a == 'r');
        auVar20[0xf] = -(cStack_429 == 'l');
        auVar20 = auVar20 & auVar19;
        if ((ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar20[0xf] >> 7) << 0xf) == 0xffff) {
          bVar2 = true;
        }
        stbi__hdr_gettoken(s,&local_438);
      } while (local_438 != '\0');
      if (bVar2) {
        local_4a0 = &local_438;
        stbi__hdr_gettoken(s,&local_438);
        if (cStack_436 == ' ' && CONCAT11(cStack_437,local_438) == 0x592d) {
          local_4a0 = &cStack_435;
          uVar9 = strtol(local_4a0,&local_4a0,10);
          local_4a0 = local_4a0 + -1;
          do {
            pcVar13 = local_4a0;
            local_4a0 = pcVar13 + 1;
          } while (pcVar13[1] == ' ');
          iVar6 = strncmp(local_4a0,"+X ",3);
          if (iVar6 == 0) {
            local_4a0 = pcVar13 + 4;
            uVar10 = strtol(local_4a0,(char **)0x0,10);
            iVar6 = (int)uVar9;
            if ((iVar6 < 0x1000001) && (iVar8 = (int)uVar10, iVar8 < 0x1000001)) {
              *x = iVar8;
              *y = iVar6;
              if (comp != (int *)0x0) {
                *comp = 3;
              }
              iVar7 = stbi__mad4sizes_valid(iVar8,iVar6,4,4,req_comp);
              if (iVar7 != 0) {
                output = (float *)stbi__malloc_mad4(iVar8,iVar6,4,4,req_comp);
                if (output != (float *)0x0) {
                  iVar7 = 0;
                  local_470 = uVar9;
                  if (iVar8 - 0x8000U < 0xffff8008) goto LAB_0045d2f1;
                  if (iVar6 < 1) {
                    __ptr = (stbi_uc *)0x0;
                  }
                  else {
                    local_458 = uVar10 * 4;
                    local_448 = local_458 & 0xffffffff;
                    psVar1 = s->buffer_start;
                    local_480 = s->buffer_start + 1;
                    local_460 = uVar9 & 0x7fffffff;
                    local_468 = uVar10 & 0x7fffffff;
                    local_490 = 0;
                    uVar9 = 0;
                    __ptr = (stbi_uc *)0x0;
                    local_498 = uVar10;
                    do {
                      uVar10 = local_498;
                      local_450 = uVar9;
                      sVar3 = stbi__get8(s);
                      sVar4 = stbi__get8(s);
                      sVar5 = stbi__get8(s);
                      if (((sVar3 != '\x02') || (sVar4 != '\x02')) || ((char)sVar5 < '\0')) {
                        local_440 = sVar3;
                        local_43f = sVar4;
                        local_43e = sVar5;
                        local_43d = stbi__get8(s);
                        stbi__hdr_convert(output,&local_440,req_comp_00);
                        free(__ptr);
                        iVar7 = 0;
                        iVar6 = 1;
                        do {
                          stbi__getn(s,local_43c,4);
                          stbi__hdr_convert(output + (long)((int)uVar10 * iVar7 * 4) +
                                                     (long)(iVar6 * 4),local_43c,req_comp_01);
                          iVar6 = iVar6 + 1;
                          while ((int)uVar10 <= iVar6) {
                            iVar7 = iVar7 + 1;
LAB_0045d2f1:
                            iVar6 = 0;
                            if ((int)local_470 <= iVar7) {
                              return output;
                            }
                          }
                        } while( true );
                      }
                      sVar3 = stbi__get8(s);
                      if ((uint)CONCAT11(sVar5,sVar3) != (uint)uVar10) {
                        free(output);
                        free(__ptr);
                        lVar14 = *in_FS_OFFSET;
                        pcVar13 = "invalid decoded scanline length";
                        goto LAB_0045cd91;
                      }
                      lVar14 = extraout_RDX;
                      if ((__ptr == (stbi_uc *)0x0) &&
                         (__ptr = (stbi_uc *)malloc(local_448), lVar14 = extraout_RDX_00,
                         __ptr == (stbi_uc *)0x0)) {
                        free(output);
                        goto LAB_0045d2d7;
                      }
                      local_478 = 0;
                      local_488 = __ptr;
                      do {
                        if (0 < (int)uVar10) {
                          iVar6 = 0;
                          uVar9 = uVar10 & 0xffffffff;
                          do {
                            pbVar11 = s->img_buffer;
                            if (pbVar11 < s->img_buffer_end) {
LAB_0045cfcc:
                              s->img_buffer = pbVar11 + 1;
                              bVar15 = *pbVar11;
                            }
                            else {
                              if (s->read_from_callbacks != 0) {
                                iVar8 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                                s->callback_already_read =
                                     s->callback_already_read +
                                     (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
                                if (iVar8 == 0) {
                                  s->read_from_callbacks = 0;
                                  s->img_buffer = psVar1;
                                  s->img_buffer_end = local_480;
                                  s->buffer_start[0] = '\0';
                                }
                                else {
                                  s->img_buffer = psVar1;
                                  s->img_buffer_end = psVar1 + iVar8;
                                }
                                pbVar11 = s->img_buffer;
                                lVar14 = extraout_RDX_01;
                                goto LAB_0045cfcc;
                              }
                              bVar15 = 0;
                            }
                            psVar17 = local_488;
                            if (bVar15 < 0x81) {
                              uVar18 = (uint)bVar15;
                              if ((uVar18 == 0) || ((uint)uVar9 < uVar18)) goto LAB_0045d22c;
                              lVar16 = 0;
                              do {
                                psVar12 = s->img_buffer;
                                if (psVar12 < s->img_buffer_end) {
LAB_0045d0de:
                                  s->img_buffer = psVar12 + 1;
                                  sVar3 = *psVar12;
                                }
                                else {
                                  if (s->read_from_callbacks != 0) {
                                    iVar8 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen
                                                           );
                                    s->callback_already_read =
                                         s->callback_already_read +
                                         (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
                                    if (iVar8 == 0) {
                                      s->read_from_callbacks = 0;
                                      s->img_buffer = psVar1;
                                      s->img_buffer_end = local_480;
                                      s->buffer_start[0] = '\0';
                                    }
                                    else {
                                      s->img_buffer = psVar1;
                                      s->img_buffer_end = psVar1 + iVar8;
                                    }
                                    psVar12 = s->img_buffer;
                                    lVar14 = extraout_RDX_03;
                                    goto LAB_0045d0de;
                                  }
                                  sVar3 = '\0';
                                }
                                psVar17[lVar16 * 4 + (long)iVar6 * 4] = sVar3;
                                lVar16 = lVar16 + 1;
                              } while (uVar18 != (uint)lVar16);
                              iVar6 = iVar6 + (uint)lVar16;
                            }
                            else {
                              psVar17 = s->img_buffer;
                              if (psVar17 < s->img_buffer_end) {
LAB_0045d135:
                                s->img_buffer = psVar17 + 1;
                                sVar3 = *psVar17;
                              }
                              else {
                                if (s->read_from_callbacks != 0) {
                                  iVar8 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                                  s->callback_already_read =
                                       s->callback_already_read +
                                       (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original);
                                  if (iVar8 == 0) {
                                    s->read_from_callbacks = 0;
                                    s->img_buffer = psVar1;
                                    s->img_buffer_end = local_480;
                                    s->buffer_start[0] = '\0';
                                  }
                                  else {
                                    s->img_buffer = psVar1;
                                    s->img_buffer_end = psVar1 + iVar8;
                                  }
                                  psVar17 = s->img_buffer;
                                  lVar14 = extraout_RDX_02;
                                  goto LAB_0045d135;
                                }
                                sVar3 = '\0';
                              }
                              if ((uint)uVar9 < (bVar15 & 0x7f)) {
LAB_0045d22c:
                                free(output);
                                free(__ptr);
                                lVar14 = *in_FS_OFFSET;
                                pcVar13 = "corrupt";
                                goto LAB_0045cd91;
                              }
                              if ((bVar15 & 0x7f) != 0) {
                                lVar14 = 0;
                                do {
                                  local_488[lVar14 * 4 + (long)iVar6 * 4] = sVar3;
                                  lVar14 = lVar14 + 1;
                                } while ((bVar15 & 0x7f) != (uint)lVar14);
                                iVar6 = iVar6 + (uint)lVar14;
                              }
                            }
                            uVar18 = (int)local_498 - iVar6;
                            uVar9 = (ulong)uVar18;
                            uVar10 = local_498;
                          } while (uVar18 != 0 && iVar6 <= (int)local_498);
                        }
                        local_478 = local_478 + 1;
                        local_488 = local_488 + 1;
                      } while (local_478 != 4);
                      local_478 = 4;
                      lVar16 = local_490;
                      psVar17 = __ptr;
                      uVar9 = local_468;
                      if (0 < (int)uVar10) {
                        do {
                          stbi__hdr_convert(output + ((uint)lVar16 & 0xfffffffc),psVar17,(int)lVar14
                                           );
                          lVar16 = lVar16 + 4;
                          psVar17 = psVar17 + 4;
                          uVar9 = uVar9 - 1;
                          lVar14 = extraout_RDX_04;
                        } while (uVar9 != 0);
                      }
                      uVar9 = local_450 + 1;
                      local_490 = local_490 + local_458;
                    } while (uVar9 != local_460);
                  }
                  if (__ptr == (stbi_uc *)0x0) {
                    return output;
                  }
                  free(__ptr);
                  return output;
                }
LAB_0045d2d7:
                lVar14 = *in_FS_OFFSET;
                pcVar13 = "outofmem";
                goto LAB_0045cd91;
              }
            }
            lVar14 = *in_FS_OFFSET;
            pcVar13 = "too large";
            goto LAB_0045cd91;
          }
        }
        lVar14 = *in_FS_OFFSET;
        pcVar13 = "unsupported data layout";
        goto LAB_0045cd91;
      }
    }
    lVar14 = *in_FS_OFFSET;
    pcVar13 = "unsupported format";
  }
  else {
    lVar14 = *in_FS_OFFSET;
    pcVar13 = "not HDR";
  }
LAB_0045cd91:
  *(char **)(lVar14 + -8) = pcVar13;
  return (float *)0x0;
}

Assistant:

static float *stbi__hdr_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri)
{
   char buffer[STBI__HDR_BUFLEN];
   char *token;
   int valid = 0;
   int width, height;
   stbi_uc *scanline;
   float *hdr_data;
   int len;
   unsigned char count, value;
   int i, j, k, c1,c2, z;
   const char *headerToken;
   STBI_NOTUSED(ri);

   // Check identifier
   headerToken = stbi__hdr_gettoken(s,buffer);
   if (strcmp(headerToken, "#?RADIANCE") != 0 && strcmp(headerToken, "#?RGBE") != 0)
      return stbi__errpf("not HDR", "Corrupt HDR image");

   // Parse header
   for(;;) {
      token = stbi__hdr_gettoken(s,buffer);
      if (token[0] == 0) break;
      if (strcmp(token, "FORMAT=32-bit_rle_rgbe") == 0) valid = 1;
   }

   if (!valid)    return stbi__errpf("unsupported format", "Unsupported HDR format");

   // Parse width and height
   // can't use sscanf() if we're not using stdio!
   token = stbi__hdr_gettoken(s,buffer);
   if (strncmp(token, "-Y ", 3))  return stbi__errpf("unsupported data layout", "Unsupported HDR format");
   token += 3;
   height = (int) strtol(token, &token, 10);
   while (*token == ' ') ++token;
   if (strncmp(token, "+X ", 3))  return stbi__errpf("unsupported data layout", "Unsupported HDR format");
   token += 3;
   width = (int) strtol(token, NULL, 10);

   if (height > STBI_MAX_DIMENSIONS) return stbi__errpf("too large","Very large image (corrupt?)");
   if (width > STBI_MAX_DIMENSIONS) return stbi__errpf("too large","Very large image (corrupt?)");

   *x = width;
   *y = height;

   if (comp) *comp = 3;
   if (req_comp == 0) req_comp = 3;

   if (!stbi__mad4sizes_valid(width, height, req_comp, sizeof(float), 0))
      return stbi__errpf("too large", "HDR image is too large");

   // Read data
   hdr_data = (float *) stbi__malloc_mad4(width, height, req_comp, sizeof(float), 0);
   if (!hdr_data)
      return stbi__errpf("outofmem", "Out of memory");

   // Load image data
   // image data is stored as some number of sca
   if ( width < 8 || width >= 32768) {
      // Read flat data
      for (j=0; j < height; ++j) {
         for (i=0; i < width; ++i) {
            stbi_uc rgbe[4];
           main_decode_loop:
            stbi__getn(s, rgbe, 4);
            stbi__hdr_convert(hdr_data + j * width * req_comp + i * req_comp, rgbe, req_comp);
         }
      }
   } else {
      // Read RLE-encoded data
      scanline = NULL;

      for (j = 0; j < height; ++j) {
         c1 = stbi__get8(s);
         c2 = stbi__get8(s);
         len = stbi__get8(s);
         if (c1 != 2 || c2 != 2 || (len & 0x80)) {
            // not run-length encoded, so we have to actually use THIS data as a decoded
            // pixel (note this can't be a valid pixel--one of RGB must be >= 128)
            stbi_uc rgbe[4];
            rgbe[0] = (stbi_uc) c1;
            rgbe[1] = (stbi_uc) c2;
            rgbe[2] = (stbi_uc) len;
            rgbe[3] = (stbi_uc) stbi__get8(s);
            stbi__hdr_convert(hdr_data, rgbe, req_comp);
            i = 1;
            j = 0;
            STBI_FREE(scanline);
            goto main_decode_loop; // yes, this makes no sense
         }
         len <<= 8;
         len |= stbi__get8(s);
         if (len != width) { STBI_FREE(hdr_data); STBI_FREE(scanline); return stbi__errpf("invalid decoded scanline length", "corrupt HDR"); }
         if (scanline == NULL) {
            scanline = (stbi_uc *) stbi__malloc_mad2(width, 4, 0);
            if (!scanline) {
               STBI_FREE(hdr_data);
               return stbi__errpf("outofmem", "Out of memory");
            }
         }

         for (k = 0; k < 4; ++k) {
            int nleft;
            i = 0;
            while ((nleft = width - i) > 0) {
               count = stbi__get8(s);
               if (count > 128) {
                  // Run
                  value = stbi__get8(s);
                  count -= 128;
                  if ((count == 0) || (count > nleft)) { STBI_FREE(hdr_data); STBI_FREE(scanline); return stbi__errpf("corrupt", "bad RLE data in HDR"); }
                  for (z = 0; z < count; ++z)
                     scanline[i++ * 4 + k] = value;
               } else {
                  // Dump
                  if ((count == 0) || (count > nleft)) { STBI_FREE(hdr_data); STBI_FREE(scanline); return stbi__errpf("corrupt", "bad RLE data in HDR"); }
                  for (z = 0; z < count; ++z)
                     scanline[i++ * 4 + k] = stbi__get8(s);
               }
            }
         }
         for (i=0; i < width; ++i)
            stbi__hdr_convert(hdr_data+(j*width + i)*req_comp, scanline + i*4, req_comp);
      }
      if (scanline)
         STBI_FREE(scanline);
   }

   return hdr_data;
}